

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlneuron.cxx
# Opt level: O2

void __thiscall
MlPotassiumChannel::MlPotassiumChannel
          (MlPotassiumChannel *this,double weight,double reversal,string *name,string *type)

{
  allocator<char> local_e2;
  allocator<char> local_e1;
  string local_e0;
  Unit local_c0;
  string local_58;
  string local_38;
  
  StochasticFunction::StochasticFunction(&this->super_StochasticFunction,(Time *)0x0,name,type);
  (this->super_StochasticFunction).super_StochasticProcess.super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__MlPotassiumChannel_001559e8;
  (this->super_StochasticFunction).super_StochasticProcess.super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__MlPotassiumChannel_00155a98;
  (this->super_StochasticFunction).super_StochasticProcess.super_Physical._vptr_Physical =
       (_func_int **)&PTR__MlPotassiumChannel_00155ae0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_e2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"Differential Equation",&local_e1);
  DifferentialEquation::DifferentialEquation(&this->potassNt,(string *)&local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"m",(allocator<char> *)&local_e0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"V",&local_e2);
  Unit::Unit(&local_c0,&local_38,&local_58);
  Unit::operator=(&(this->super_StochasticFunction).super_StochasticProcess.super_Physical.
                   physicalUnit,&local_c0);
  Unit::~Unit(&local_c0);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"reversal-potential",(allocator<char> *)&local_e0);
  Parametric::addParameter((Parametric *)this,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"weight",(allocator<char> *)&local_e0);
  Parametric::addParameter((Parametric *)this,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  return;
}

Assistant:

MlPotassiumChannel::MlPotassiumChannel(double weight, double reversal, const string& name, const string& type)
	: StochasticFunction(0, name, type)
{
	physicalUnit = Unit("m","V");
	addParameter("reversal-potential");
	addParameter("weight");
}